

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t archive_block_is_null(char *p)

{
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if ((int)lVar1 == 0x200) {
      return L'\x01';
    }
    if (p[lVar1] != '\0') break;
    lVar1 = lVar1 + 1;
  }
  return L'\0';
}

Assistant:

static int
archive_block_is_null(const char *p)
{
	unsigned i;

	for (i = 0; i < 512; i++)
		if (*p++)
			return (0);
	return (1);
}